

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O0

bool __thiscall BamTools::SplitTool::SplitToolPrivate::Run(SplitToolPrivate *this)

{
  bool bVar1;
  ostream *poVar2;
  long *in_RDI;
  SplitToolPrivate *in_stack_00000030;
  SplitToolPrivate *in_stack_000001a8;
  SplitToolPrivate *in_stack_00000278;
  SplitToolPrivate *in_stack_00000328;
  bool local_1;
  
  DetermineOutputFilenameStub(in_stack_00000030);
  bVar1 = OpenReader(this);
  if (bVar1) {
    if ((*(byte *)(*in_RDI + 5) & 1) == 0) {
      if ((*(byte *)(*in_RDI + 6) & 1) == 0) {
        if ((*(byte *)(*in_RDI + 7) & 1) == 0) {
          if ((*(byte *)(*in_RDI + 8) & 1) == 0) {
            poVar2 = std::operator<<((ostream *)&std::cerr,
                                     "bamtools split ERROR: no property given to split on... ");
            poVar2 = (ostream *)
                     std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar2 = std::operator<<(poVar2,
                                     "Please use -mapped, -paired, -reference, or -tag TAG to specify desired split behavior."
                                    );
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            local_1 = false;
          }
          else {
            local_1 = SplitTag(in_stack_000001a8);
          }
        }
        else {
          local_1 = SplitReference(in_stack_00000328);
        }
      }
      else {
        local_1 = SplitPaired(in_stack_00000278);
      }
    }
    else {
      local_1 = SplitMapped(in_stack_00000278);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SplitTool::SplitToolPrivate::Run()
{

    // determine output stub
    DetermineOutputFilenameStub();

    // open up BamReader
    if (!OpenReader()) return false;

    // determine split type from settings
    if (m_settings->IsSplittingMapped) return SplitMapped();
    if (m_settings->IsSplittingPaired) return SplitPaired();
    if (m_settings->IsSplittingReference) return SplitReference();
    if (m_settings->IsSplittingTag) return SplitTag();

    // if we get here, no property was specified
    std::cerr
        << "bamtools split ERROR: no property given to split on... " << std::endl
        << "Please use -mapped, -paired, -reference, or -tag TAG to specify desired split behavior."
        << std::endl;
    return false;
}